

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

void __thiscall filesystem::path::set(path *this,string *str,path_type type)

{
  char cVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar5;
  allocator<char> local_71;
  string tmp;
  string local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenized;
  
  this->m_type = type;
  if (type != windows_path) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tmp,"/",(allocator<char> *)&tokenized);
    tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_50,str,&tmp);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&this->m_path,&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_50);
    std::__cxx11::string::~string((string *)&tmp);
    if (str->_M_string_length == 0) {
      bVar4 = false;
    }
    else {
      bVar4 = *(str->_M_dataplus)._M_p == '/';
    }
    this->m_absolute = bVar4;
    return;
  }
  std::__cxx11::string::string((string *)&tmp,(string *)str);
  if ((set(std::__cxx11::string_const&,filesystem::path::path_type)::LONG_PATH_PREFIX_abi_cxx11_ ==
       '\0') &&
     (iVar2 = __cxa_guard_acquire(&set(std::__cxx11::string_const&,filesystem::path::path_type)::
                                   LONG_PATH_PREFIX_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &set(std::__cxx11::string_const&,filesystem::path::path_type)::
                LONG_PATH_PREFIX_abi_cxx11_,"\\\\?\\",(allocator<char> *)&local_50);
    __cxa_atexit(std::__cxx11::string::~string,
                 &set(std::__cxx11::string_const&,filesystem::path::path_type)::
                  LONG_PATH_PREFIX_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&set(std::__cxx11::string_const&,filesystem::path::path_type)::
                         LONG_PATH_PREFIX_abi_cxx11_);
  }
  if ((set(std::__cxx11::string_const&,filesystem::path::path_type)::LONG_PATH_PREFIX_abi_cxx11_.
       _M_string_length <= tmp._M_string_length) &&
     (pVar5 = std::
              __mismatch<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (set(std::__cxx11::string_const&,filesystem::path::path_type)::
                         LONG_PATH_PREFIX_abi_cxx11_._M_dataplus._M_p,
                         set(std::__cxx11::string_const&,filesystem::path::path_type)::
                         LONG_PATH_PREFIX_abi_cxx11_._M_dataplus._M_p +
                         set(std::__cxx11::string_const&,filesystem::path::path_type)::
                         LONG_PATH_PREFIX_abi_cxx11_._M_string_length,tmp._M_dataplus._M_p),
     pVar5.first._M_current._M_current ==
     set(std::__cxx11::string_const&,filesystem::path::path_type)::LONG_PATH_PREFIX_abi_cxx11_.
     _M_dataplus._M_p +
     set(std::__cxx11::string_const&,filesystem::path::path_type)::LONG_PATH_PREFIX_abi_cxx11_.
     _M_string_length)) {
    std::__cxx11::string::erase((ulong)&tmp,0);
  }
  if (tmp._M_string_length < 2) {
LAB_002f014b:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->m_path,
                (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 )ZEXT816(0));
  }
  else {
    cVar1 = *tmp._M_dataplus._M_p;
    if (cVar1 != 0x5c) {
      if (tmp._M_string_length < 4) {
LAB_002f00de:
        if (tmp._M_string_length == 2) goto LAB_002f014b;
      }
      else if ((((cVar1 == 'U') && (tmp._M_dataplus._M_p[1] == 'N')) &&
               (tmp._M_dataplus._M_p[2] == 'C')) && (tmp._M_dataplus._M_p[3] == '\\')) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this->m_path,
                    (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     )ZEXT816(0));
        std::__cxx11::string::erase((ulong)&tmp,0);
LAB_002f008a:
        this->m_absolute = true;
        this->m_smb = true;
        goto LAB_002f015d;
      }
      iVar2 = isalpha((int)cVar1);
      if (((iVar2 != 0) && (tmp._M_dataplus._M_p[1] == ':')) &&
         ((tmp._M_dataplus._M_p[2] == '\\' || (tmp._M_dataplus._M_p[2] == '/')))) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&tmp);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->m_path,&local_50,&tokenized);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::erase((ulong)&tmp,0);
        this->m_absolute = true;
        this->m_smb = false;
        goto LAB_002f015d;
      }
      goto LAB_002f014b;
    }
    if (tmp._M_dataplus._M_p[1] != '\\') goto LAB_002f00de;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->m_path,
                (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 )ZEXT816(0));
    std::__cxx11::string::erase((ulong)&tmp,0);
    lVar3 = std::__cxx11::string::find_first_of((char *)&tmp,0x496ea8);
    if (lVar3 != -1) goto LAB_002f008a;
  }
  this->m_absolute = false;
  this->m_smb = false;
LAB_002f015d:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"/\\",&local_71);
  tokenize(&tokenized,&tmp,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_path,
             (this->m_path).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )tokenized.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )tokenized.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tokenized);
  std::__cxx11::string::~string((string *)&tmp);
  return;
}

Assistant:

void set(const std::string &str, path_type type = native_path) {
        m_type = type;
        if (type == windows_path) {
            std::string tmp = str;

            // Long windows paths (sometimes) begin with the prefix \\?\. It should only
            // be used when the path is >MAX_PATH characters long, so we remove it
            // for convenience and add it back (if necessary) in str()/wstr().
            static const std::string LONG_PATH_PREFIX = "\\\\?\\";
            if (tmp.length() >= LONG_PATH_PREFIX.length()
             && std::mismatch(std::begin(LONG_PATH_PREFIX), std::end(LONG_PATH_PREFIX), std::begin(tmp)).first == std::end(LONG_PATH_PREFIX)) {
                tmp.erase(0, LONG_PATH_PREFIX.length());
            }

            // Special-case handling of absolute SMB paths, which start with the prefix "\\".
            if (tmp.length() >= 2 && tmp[0] == '\\' && tmp[1] == '\\') {
                m_path = {};
                tmp.erase(0, 2);

                // Interestingly, there is a special-special case where relative paths may be specified as beginning with a "\\"
                // when a non-SMB file with a more-than-260-characters-long absolute _local_ path is double-clicked. This seems to
                // only happen with single-segment relative paths, so we can check for this condition by making sure no further
                // path separators are present.
                if (tmp.find_first_of("/\\") != std::string::npos)
                    m_absolute = m_smb = true;
                else
                    m_absolute = m_smb = false;

            // Special-case handling of absolute SMB paths, which start with the prefix "UNC\"
            } else if (tmp.length() >= 4 && tmp[0] == 'U' && tmp[1] == 'N' && tmp[2] == 'C' && tmp[3] == '\\') {
                m_path = {};
                tmp.erase(0, 4);
                m_absolute = true;
                m_smb = true;
            // Special-case handling of absolute local paths, which start with the drive letter and a colon "X:\"
            } else if (tmp.length() >= 3 && std::isalpha(tmp[0]) && tmp[1] == ':' && (tmp[2] == '\\' || tmp[2] == '/')) {
                m_path = {tmp.substr(0, 2)};
                tmp.erase(0, 3);
                m_absolute = true;
                m_smb = false;
            // Relative path
            } else {
                m_path = {};
                m_absolute = false;
                m_smb = false;
            }

            std::vector<std::string> tokenized = tokenize(tmp, "/\\");
            m_path.insert(std::end(m_path), std::begin(tokenized), std::end(tokenized));
        } else {
            m_path = tokenize(str, "/");
            m_absolute = !str.empty() && str[0] == '/';
        }
    }